

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O0

void __thiscall lzham::symbol_codec::start_arith_decoding(symbol_codec *this)

{
  uint uVar1;
  symbol_codec *in_RDI;
  uint num_bits;
  symbol_codec *this_00;
  
  in_RDI->m_arith_length = 0xffffffff;
  in_RDI->m_arith_value = 0;
  num_bits = (uint)((ulong)in_RDI >> 0x20);
  this_00 = in_RDI;
  uVar1 = get_bits(in_RDI,num_bits);
  in_RDI->m_arith_value = uVar1 << 0x18;
  uVar1 = get_bits(this_00,num_bits);
  in_RDI->m_arith_value = uVar1 << 0x10 | in_RDI->m_arith_value;
  uVar1 = get_bits(this_00,num_bits);
  in_RDI->m_arith_value = uVar1 << 8 | in_RDI->m_arith_value;
  uVar1 = get_bits(this_00,num_bits);
  in_RDI->m_arith_value = uVar1 | in_RDI->m_arith_value;
  return;
}

Assistant:

void symbol_codec::start_arith_decoding()
   {
      LZHAM_ASSERT(m_mode == cDecoding);

      m_arith_length = cSymbolCodecArithMaxLen;
      m_arith_value = 0;

      m_arith_value = (get_bits(8) << 24);
      m_arith_value |= (get_bits(8) << 16);
      m_arith_value |= (get_bits(8) << 8);
      m_arith_value |= get_bits(8);
   }